

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O2

Vec_Int_t * Wlc_NtkFindConflict(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues,int nFrames)

{
  Vec_Int_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int i;
  int iVar6;
  uint uVar7;
  int i_00;
  int iVar8;
  Vec_Wec_t *p_01;
  Wlc_Obj_t *pObj;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar9;
  Vec_Int_t *p_03;
  word wVar10;
  word wVar11;
  int iVar12;
  int iVar13;
  
  p_01 = Vec_WecAlloc((int)p);
  if (vMemObjs->nSize * nFrames * 3 != vValues->nSize) {
    __assert_fail("3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                  ,0x357,
                  "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)");
  }
  Wlc_NtkCleanCopy(p);
  p_00 = &p->vCopies;
  for (iVar12 = 0; iVar1 = vMemObjs->nSize, iVar12 < iVar1; iVar12 = iVar12 + 1) {
    iVar1 = Vec_IntEntry(vMemObjs,iVar12);
    Vec_IntWriteEntry(p_00,iVar1,iVar12);
  }
  iVar12 = 0;
  if (nFrames < 1) {
    nFrames = iVar12;
  }
  for (; iVar12 != nFrames; iVar12 = iVar12 + 1) {
    for (iVar13 = 0; iVar13 < iVar1; iVar13 = iVar13 + 1) {
      iVar1 = Vec_IntEntry(vMemObjs,iVar13);
      pObj = Wlc_NtkObj(p,iVar1);
      if ((undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x36) {
        p_02 = Wlc_NtkTrace(p,pObj,iVar12,vMemObjs,vValues);
        iVar1 = Wlc_NtkTraceCheckConfict(p,p_02,vMemObjs,vValues);
        if (iVar1 != 0) goto LAB_00302907;
        Vec_WecPushLevel(p_01);
        pVVar9 = Vec_WecEntryLast(p_01);
        Vec_IntAppend(pVVar9,p_02);
        Vec_IntFree(p_02);
      }
      iVar1 = vMemObjs->nSize;
    }
  }
  iVar12 = p_01->nSize;
  iVar1 = 0;
  if (iVar12 < 1) {
    iVar12 = 0;
  }
  do {
    if (iVar1 == iVar12) {
      Vec_WecFree(p_01);
      return (Vec_Int_t *)0x0;
    }
    pVVar9 = Vec_WecEntry(p_01,iVar1);
    for (iVar13 = 0; iVar1 != iVar13; iVar13 = iVar13 + 1) {
      p_03 = Vec_WecEntry(p_01,iVar13);
      iVar2 = Vec_IntEntry(pVVar9,0);
      iVar3 = Vec_IntEntry(p_03,0);
      if (iVar2 == iVar3) {
        iVar4 = Vec_IntEntryLast(pVVar9);
        uVar5 = Vec_IntEntryLast(pVVar9);
        i = Vec_IntEntry(p_00,iVar4 >> 0xb);
        iVar2 = vMemObjs->nSize;
        iVar6 = Vec_IntEntryLast(p_03);
        uVar7 = Vec_IntEntryLast(p_03);
        i_00 = Vec_IntEntry(p_00,iVar6 >> 0xb);
        iVar3 = vMemObjs->nSize;
        iVar8 = Vec_IntEntry(vMemObjs,i);
        if (iVar4 >> 0xb != iVar8) {
          __assert_fail("iObj1 == Vec_IntEntry(vMemObjs, iNum1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x37b,
                        "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                       );
        }
        iVar4 = Vec_IntEntry(vMemObjs,i_00);
        if (iVar6 >> 0xb != iVar4) {
          __assert_fail("iObj2 == Vec_IntEntry(vMemObjs, iNum2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcMem.c"
                        ,0x37c,
                        "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                       );
        }
        iVar2 = ((uVar5 >> 1 & 0x3ff) * iVar2 + i) * 3;
        iVar3 = ((uVar7 >> 1 & 0x3ff) * iVar3 + i_00) * 3;
        wVar10 = Vec_WrdEntry(vValues,iVar2 + 1);
        wVar11 = Vec_WrdEntry(vValues,iVar3 + 1);
        if (wVar10 == wVar11) {
          wVar10 = Vec_WrdEntry(vValues,iVar2 + 2);
          wVar11 = Vec_WrdEntry(vValues,iVar3 + 2);
          if (wVar10 != wVar11) {
            p_02 = Vec_IntAlloc(100);
            if (pVVar9->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
            }
            uVar5 = pVVar9->nSize - 1;
            pVVar9->nSize = uVar5;
            Vec_IntPush(p_02,pVVar9->pArray[uVar5]);
            for (iVar12 = 1; iVar12 < pVVar9->nSize; iVar12 = iVar12 + 1) {
              iVar1 = Vec_IntEntry(pVVar9,iVar12);
              Vec_IntPushUnique(p_02,iVar1);
            }
            for (iVar12 = 1; iVar12 < p_03->nSize; iVar12 = iVar12 + 1) {
              iVar1 = Vec_IntEntry(p_03,iVar12);
              Vec_IntPushUnique(p_02,iVar1);
            }
LAB_00302907:
            Vec_WecFree(p_01);
            return p_02;
          }
        }
      }
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkFindConflict( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, int nFrames )
{
    Wlc_Obj_t * pObj; int i, f, Entry;
    Vec_Wec_t * vTraces = Vec_WecAlloc( 100 );
    Vec_Int_t * vTrace, * vTrace1, * vTrace2;
    assert( 3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues) );
    Wlc_NtkCleanCopy( p );
    Vec_IntForEachEntry( vMemObjs, Entry, i )
        Wlc_ObjSetCopy( p, Entry, i );
    for ( f = 0; f < nFrames; f++ )
    {
        Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
        {
            if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
                continue;
            vTrace = Wlc_NtkTrace( p, pObj, f, vMemObjs, vValues );
            if ( Wlc_NtkTraceCheckConfict( p, vTrace, vMemObjs, vValues ) )
            {
                Vec_WecFree( vTraces );
                return vTrace;
            }
            Vec_WecPushLevel( vTraces );
            Vec_IntAppend( Vec_WecEntryLast(vTraces), vTrace );
            Vec_IntFree( vTrace );
        }
    }
    // check if there are any common read addresses
    Vec_WecForEachLevel( vTraces, vTrace1, i )
    Vec_WecForEachLevelStop( vTraces, vTrace2, f, i )
        if ( Vec_IntEntry(vTrace1, 0) == Vec_IntEntry(vTrace2, 0) )
        {
            int iObj1 = Vec_IntEntryLast(vTrace1) >> 11;
            int iFrm1 =(Vec_IntEntryLast(vTrace1) >> 1) & 0x3FF;
            int iNum1 = Wlc_ObjCopy( p, iObj1 );
            int iInd1 = 3*(iFrm1*Vec_IntSize(vMemObjs) + iNum1);

            int iObj2 = Vec_IntEntryLast(vTrace2) >> 11;
            int iFrm2 =(Vec_IntEntryLast(vTrace2) >> 1) & 0x3FF;
            int iNum2 = Wlc_ObjCopy( p, iObj2 );
            int iInd2 = 3*(iFrm2*Vec_IntSize(vMemObjs) + iNum2);

            assert( iObj1 == Vec_IntEntry(vMemObjs, iNum1) );
            assert( iObj2 == Vec_IntEntry(vMemObjs, iNum2) );
            if ( Vec_WrdEntry(vValues, iInd1 + 1) == Vec_WrdEntry(vValues, iInd2 + 1) &&  // equal address
                 Vec_WrdEntry(vValues, iInd1 + 2) != Vec_WrdEntry(vValues, iInd2 + 2) )   // diff data
            {
                vTrace = Vec_IntAlloc( 100 );
                Vec_IntPush( vTrace, Vec_IntPop(vTrace1) );
                Vec_IntForEachEntryStart( vTrace1, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_IntForEachEntryStart( vTrace2, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_WecFree( vTraces );
                return vTrace;
            }
        }
    Vec_WecFree( vTraces );
    return NULL;
}